

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

size_t __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  Type *value;
  size_t sVar1;
  int local_1c;
  size_t sStack_18;
  int i;
  size_t allocated_bytes;
  RepeatedPtrFieldBase *this_local;
  
  sStack_18 = (long)this->total_size_ << 3;
  if (this->rep_ != (Rep *)0x0) {
    for (local_1c = 0; local_1c < this->rep_->allocated_size; local_1c = local_1c + 1) {
      value = cast<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (this->rep_->elements[local_1c]);
      sVar1 = StringTypeHandler::SpaceUsedLong(value);
      sStack_18 = sVar1 + sStack_18;
    }
    sStack_18 = sStack_18 + 8;
  }
  return sStack_18;
}

Assistant:

inline size_t RepeatedPtrFieldBase::SpaceUsedExcludingSelfLong() const {
  size_t allocated_bytes = static_cast<size_t>(total_size_) * sizeof(void*);
  if (rep_ != nullptr) {
    for (int i = 0; i < rep_->allocated_size; ++i) {
      allocated_bytes +=
          TypeHandler::SpaceUsedLong(*cast<TypeHandler>(rep_->elements[i]));
    }
    allocated_bytes += kRepHeaderSize;
  }
  return allocated_bytes;
}